

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O3

istream * operator>>(istream *in,lda_math_mode *mmode)

{
  int iVar1;
  invalid_option_value *this;
  lda_math_mode lVar2;
  string token;
  undefined1 *local_40;
  undefined8 local_38;
  undefined1 local_30 [16];
  
  local_38 = 0;
  local_30[0] = 0;
  local_40 = local_30;
  std::operator>>(in,(string *)&local_40);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 == 0) {
    lVar2 = USE_SIMD;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    lVar2 = USE_PRECISE;
    if (iVar1 != 0) {
      iVar1 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)&local_40);
        lVar2 = USE_FAST_APPROX;
        if (iVar1 != 0) {
          iVar1 = std::__cxx11::string::compare((char *)&local_40);
          if (iVar1 != 0) {
            this = (invalid_option_value *)__cxa_allocate_exception(0xc0);
            boost::program_options::invalid_option_value::invalid_option_value
                      (this,(string *)&local_40);
            __cxa_throw(this,&boost::program_options::invalid_option_value::typeinfo,
                        boost::program_options::error_with_option_name::~error_with_option_name);
          }
        }
      }
    }
  }
  *mmode = lVar2;
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  return in;
}

Assistant:

std::istream &operator>>(std::istream &in, lda_math_mode &mmode)
{
  using namespace boost::program_options;

  std::string token;
  in >> token;
  if (token == "simd")
    mmode = USE_SIMD;
  else if (token == "accuracy" || token == "precise")
    mmode = USE_PRECISE;
  else if (token == "fast-approx" || token == "approx")
    mmode = USE_FAST_APPROX;
  else
    throw boost::program_options::invalid_option_value(token);
  return in;
}